

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O3

void __thiscall HFactor::colFixMax(HFactor *this,int iCol)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar1 = (long)(this->MCcountA).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iCol];
  if (lVar1 < 1) {
    dVar4 = 0.0;
  }
  else {
    lVar2 = (long)(this->MCstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iCol];
    lVar1 = lVar1 + lVar2;
    dVar3 = 0.0;
    do {
      dVar4 = ABS((this->MCvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar2]);
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
      }
      lVar2 = lVar2 + 1;
      dVar3 = dVar4;
    } while (lVar2 < lVar1);
    dVar4 = dVar4 * 0.1;
  }
  (this->MCminpivot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iCol] = dVar4;
  return;
}

Assistant:

void colFixMax(const int iCol) {
        double maxValue = 0;
        for (int k = MCstart[iCol]; k < MCstart[iCol] + MCcountA[iCol]; k++)
            maxValue = max(maxValue, fabs(MCvalue[k]));
        MCminpivot[iCol] = maxValue * 0.1;
    }